

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load(CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  int iVar6;
  CImgArgumentException *this_00;
  char *pcVar7;
  char *pcVar8;
  uint *puVar9;
  CImg<unsigned_char> *pCVar10;
  CImgIOException *this_01;
  CImgIOException *anon_var_0_3;
  CImgIOException *anon_var_0_2;
  char *f_type;
  CImgIOException *anon_var_0_1;
  FILE *file;
  CImgIOException *anon_var_0;
  uint omode;
  char *ext;
  CImg<char> filename_local;
  char *filename_local_1;
  CImg<unsigned_char> *this_local;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar7 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar7 = "";
    }
    pcVar8 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  iVar6 = cimg::strncasecmp(filename,"http://",7);
  if ((iVar6 == 0) || (iVar6 = cimg::strncasecmp(filename,"https://",8), iVar6 == 0)) {
    CImg<char>::CImg((CImg<char> *)&ext,0x100,1,1,1);
    pcVar7 = cimg_library::CImg::operator_cast_to_char_((CImg *)&ext);
    pcVar7 = cimg::load_network(filename,pcVar7,0,false);
    load(this,pcVar7);
    pcVar7 = cimg_library::CImg::operator_cast_to_char_((CImg *)&ext);
    remove(pcVar7);
    CImg<char>::~CImg((CImg<char> *)&ext);
  }
  else {
    pcVar7 = cimg::split_filename(filename,(char *)0x0);
    puVar9 = cimg::exception_mode();
    uVar1 = *puVar9;
    cimg::exception_mode(0);
    iVar6 = cimg::strcasecmp(pcVar7,"asc");
    if (iVar6 == 0) {
      load_ascii(this,filename);
    }
    else {
      iVar6 = cimg::strcasecmp(pcVar7,"dlm");
      if ((iVar6 == 0) || (iVar6 = cimg::strcasecmp(pcVar7,"txt"), iVar6 == 0)) {
        load_dlm(this,filename);
      }
      else {
        iVar6 = cimg::strcasecmp(pcVar7,"bmp");
        if (iVar6 == 0) {
          load_bmp(this,filename);
        }
        else {
          iVar6 = cimg::strcasecmp(pcVar7,"jpg");
          if ((((iVar6 == 0) || (iVar6 = cimg::strcasecmp(pcVar7,"jpeg"), iVar6 == 0)) ||
              (iVar6 = cimg::strcasecmp(pcVar7,"jpe"), iVar6 == 0)) ||
             ((iVar6 = cimg::strcasecmp(pcVar7,"jfif"), iVar6 == 0 ||
              (iVar6 = cimg::strcasecmp(pcVar7,"jif"), iVar6 == 0)))) {
            load_jpeg(this,filename);
          }
          else {
            iVar6 = cimg::strcasecmp(pcVar7,"png");
            if (iVar6 == 0) {
              load_png(this,filename);
            }
            else {
              iVar6 = cimg::strcasecmp(pcVar7,"ppm");
              if (((iVar6 == 0) || (iVar6 = cimg::strcasecmp(pcVar7,"pgm"), iVar6 == 0)) ||
                 ((iVar6 = cimg::strcasecmp(pcVar7,"pnm"), iVar6 == 0 ||
                  ((iVar6 = cimg::strcasecmp(pcVar7,"pbm"), iVar6 == 0 ||
                   (iVar6 = cimg::strcasecmp(pcVar7,"pnk"), iVar6 == 0)))))) {
                load_pnm(this,filename);
              }
              else {
                iVar6 = cimg::strcasecmp(pcVar7,"pfm");
                if (iVar6 == 0) {
                  load_pfm(this,filename);
                }
                else {
                  iVar6 = cimg::strcasecmp(pcVar7,"tif");
                  if ((iVar6 == 0) || (iVar6 = cimg::strcasecmp(pcVar7,"tiff"), iVar6 == 0)) {
                    load_tiff(this,filename,0,0xffffffff,1,(float *)0x0,(CImg<char> *)0x0);
                  }
                  else {
                    iVar6 = cimg::strcasecmp(pcVar7,"exr");
                    if (iVar6 == 0) {
                      load_exr(this,filename);
                    }
                    else {
                      iVar6 = cimg::strcasecmp(pcVar7,"cr2");
                      if (((((iVar6 == 0) || (iVar6 = cimg::strcasecmp(pcVar7,"crw"), iVar6 == 0))
                           || (iVar6 = cimg::strcasecmp(pcVar7,"dcr"), iVar6 == 0)) ||
                          ((((iVar6 = cimg::strcasecmp(pcVar7,"mrw"), iVar6 == 0 ||
                             (iVar6 = cimg::strcasecmp(pcVar7,"nef"), iVar6 == 0)) ||
                            ((iVar6 = cimg::strcasecmp(pcVar7,"orf"), iVar6 == 0 ||
                             ((iVar6 = cimg::strcasecmp(pcVar7,"pix"), iVar6 == 0 ||
                              (iVar6 = cimg::strcasecmp(pcVar7,"ptx"), iVar6 == 0)))))) ||
                           (iVar6 = cimg::strcasecmp(pcVar7,"raf"), iVar6 == 0)))) ||
                         (iVar6 = cimg::strcasecmp(pcVar7,"srf"), iVar6 == 0)) {
                        load_dcraw_external(this,filename);
                      }
                      else {
                        iVar6 = cimg::strcasecmp(pcVar7,"gif");
                        if (iVar6 == 0) {
                          load_gif_external(this,filename,'z',0.0);
                        }
                        else {
                          iVar6 = cimg::strcasecmp(pcVar7,"dcm");
                          if ((iVar6 == 0) || (iVar6 = cimg::strcasecmp(pcVar7,"dicom"), iVar6 == 0)
                             ) {
                            load_medcon_external(this,filename);
                          }
                          else {
                            iVar6 = cimg::strcasecmp(pcVar7,"hdr");
                            if ((iVar6 == 0) || (iVar6 = cimg::strcasecmp(pcVar7,"nii"), iVar6 == 0)
                               ) {
                              load_analyze(this,filename,(float *)0x0);
                            }
                            else {
                              iVar6 = cimg::strcasecmp(pcVar7,"par");
                              if ((iVar6 == 0) ||
                                 (iVar6 = cimg::strcasecmp(pcVar7,"rec"), iVar6 == 0)) {
                                load_parrec(this,filename,'c',0.0);
                              }
                              else {
                                iVar6 = cimg::strcasecmp(pcVar7,"mnc");
                                if (iVar6 == 0) {
                                  load_minc2(this,filename);
                                }
                                else {
                                  iVar6 = cimg::strcasecmp(pcVar7,"inr");
                                  if (iVar6 == 0) {
                                    load_inr(this,filename,(float *)0x0);
                                  }
                                  else {
                                    iVar6 = cimg::strcasecmp(pcVar7,"pan");
                                    if (iVar6 == 0) {
                                      load_pandore(this,filename);
                                    }
                                    else {
                                      iVar6 = cimg::strcasecmp(pcVar7,"cimg");
                                      if (((iVar6 == 0) ||
                                          (iVar6 = cimg::strcasecmp(pcVar7,"cimgz"), iVar6 == 0)) ||
                                         (*pcVar7 == '\0')) {
                                        pCVar10 = load_cimg(this,filename,'z',0.0);
                                        return pCVar10;
                                      }
                                      iVar6 = cimg::strcasecmp(pcVar7,"gz");
                                      if (iVar6 == 0) {
                                        load_gzip_external(this,filename);
                                      }
                                      else {
                                        iVar6 = cimg::strcasecmp(pcVar7,"avi");
                                        if (((((iVar6 != 0) &&
                                              (iVar6 = cimg::strcasecmp(pcVar7,"mov"), iVar6 != 0))
                                             && ((iVar6 = cimg::strcasecmp(pcVar7,"asf"), iVar6 != 0
                                                 && ((iVar6 = cimg::strcasecmp(pcVar7,"divx"),
                                                     iVar6 != 0 &&
                                                     (iVar6 = cimg::strcasecmp(pcVar7,"flv"),
                                                     iVar6 != 0)))))) &&
                                            ((iVar6 = cimg::strcasecmp(pcVar7,"mpg"), iVar6 != 0 &&
                                             (((((((iVar6 = cimg::strcasecmp(pcVar7,"m1v"),
                                                   iVar6 != 0 &&
                                                   (iVar6 = cimg::strcasecmp(pcVar7,"m2v"),
                                                   iVar6 != 0)) &&
                                                  (iVar6 = cimg::strcasecmp(pcVar7,"m4v"),
                                                  iVar6 != 0)) &&
                                                 ((iVar6 = cimg::strcasecmp(pcVar7,"mjp"),
                                                  iVar6 != 0 &&
                                                  (iVar6 = cimg::strcasecmp(pcVar7,"mp4"),
                                                  iVar6 != 0)))) &&
                                                (iVar6 = cimg::strcasecmp(pcVar7,"mkv"), iVar6 != 0)
                                                ) && ((iVar6 = cimg::strcasecmp(pcVar7,"mpe"),
                                                      iVar6 != 0 &&
                                                      (iVar6 = cimg::strcasecmp(pcVar7,"movie"),
                                                      iVar6 != 0)))) &&
                                              ((iVar6 = cimg::strcasecmp(pcVar7,"ogm"), iVar6 != 0
                                               && (((iVar6 = cimg::strcasecmp(pcVar7,"ogg"),
                                                    iVar6 != 0 &&
                                                    (iVar6 = cimg::strcasecmp(pcVar7,"ogv"),
                                                    iVar6 != 0)) &&
                                                   (iVar6 = cimg::strcasecmp(pcVar7,"qt"),
                                                   iVar6 != 0)))))))))) &&
                                           ((((iVar6 = cimg::strcasecmp(pcVar7,"rm"), iVar6 != 0 &&
                                              (iVar6 = cimg::strcasecmp(pcVar7,"vob"), iVar6 != 0))
                                             && (iVar6 = cimg::strcasecmp(pcVar7,"wmv"), iVar6 != 0)
                                             ) && ((iVar6 = cimg::strcasecmp(pcVar7,"xvid"),
                                                   iVar6 != 0 &&
                                                   (iVar6 = cimg::strcasecmp(pcVar7,"mpeg"),
                                                   iVar6 != 0)))))) {
                                          this_01 = (CImgIOException *)
                                                    __cxa_allocate_exception(0x10);
                                          pcVar7 = pixel_type();
                                          CImgIOException::CImgIOException
                                                    (this_01,"CImg<%s>::load()",pcVar7);
                                          __cxa_throw(this_01,&CImgIOException::typeinfo,
                                                      CImgIOException::~CImgIOException);
                                        }
                                        load_video(this,filename,0,0xffffffff,1,'z',0.0);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    cimg::exception_mode(uVar1);
  }
  return this;
}

Assistant:

CImg<T>& load(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load(): Specified filename is (null).",
                                    cimg_instance);

      if (!cimg::strncasecmp(filename,"http://",7) || !cimg::strncasecmp(filename,"https://",8)) {
        CImg<charT> filename_local(256);
        load(cimg::load_network(filename,filename_local));
        std::remove(filename_local);
        return *this;
      }

      const char *const ext = cimg::split_filename(filename);
      const unsigned int omode = cimg::exception_mode();
      cimg::exception_mode(0);
      try {
#ifdef cimg_load_plugin
        cimg_load_plugin(filename);
#endif
#ifdef cimg_load_plugin1
        cimg_load_plugin1(filename);
#endif
#ifdef cimg_load_plugin2
        cimg_load_plugin2(filename);
#endif
#ifdef cimg_load_plugin3
        cimg_load_plugin3(filename);
#endif
#ifdef cimg_load_plugin4
        cimg_load_plugin4(filename);
#endif
#ifdef cimg_load_plugin5
        cimg_load_plugin5(filename);
#endif
#ifdef cimg_load_plugin6
        cimg_load_plugin6(filename);
#endif
#ifdef cimg_load_plugin7
        cimg_load_plugin7(filename);
#endif
#ifdef cimg_load_plugin8
        cimg_load_plugin8(filename);
#endif
        // Ascii formats
        if (!cimg::strcasecmp(ext,"asc")) load_ascii(filename);
        else if (!cimg::strcasecmp(ext,"dlm") ||
                 !cimg::strcasecmp(ext,"txt")) load_dlm(filename);

        // 2d binary formats
        else if (!cimg::strcasecmp(ext,"bmp")) load_bmp(filename);
        else if (!cimg::strcasecmp(ext,"jpg") ||
                 !cimg::strcasecmp(ext,"jpeg") ||
                 !cimg::strcasecmp(ext,"jpe") ||
                 !cimg::strcasecmp(ext,"jfif") ||
                 !cimg::strcasecmp(ext,"jif")) load_jpeg(filename);
        else if (!cimg::strcasecmp(ext,"png")) load_png(filename);
        else if (!cimg::strcasecmp(ext,"ppm") ||
                 !cimg::strcasecmp(ext,"pgm") ||
                 !cimg::strcasecmp(ext,"pnm") ||
                 !cimg::strcasecmp(ext,"pbm") ||
                 !cimg::strcasecmp(ext,"pnk")) load_pnm(filename);
        else if (!cimg::strcasecmp(ext,"pfm")) load_pfm(filename);
        else if (!cimg::strcasecmp(ext,"tif") ||
                 !cimg::strcasecmp(ext,"tiff")) load_tiff(filename);
        else if (!cimg::strcasecmp(ext,"exr")) load_exr(filename);
        else if (!cimg::strcasecmp(ext,"cr2") ||
                 !cimg::strcasecmp(ext,"crw") ||
                 !cimg::strcasecmp(ext,"dcr") ||
                 !cimg::strcasecmp(ext,"mrw") ||
                 !cimg::strcasecmp(ext,"nef") ||
                 !cimg::strcasecmp(ext,"orf") ||
                 !cimg::strcasecmp(ext,"pix") ||
                 !cimg::strcasecmp(ext,"ptx") ||
                 !cimg::strcasecmp(ext,"raf") ||
                 !cimg::strcasecmp(ext,"srf")) load_dcraw_external(filename);
        else if (!cimg::strcasecmp(ext,"gif")) load_gif_external(filename);

        // 3d binary formats
        else if (!cimg::strcasecmp(ext,"dcm") ||
                 !cimg::strcasecmp(ext,"dicom")) load_medcon_external(filename);
        else if (!cimg::strcasecmp(ext,"hdr") ||
                 !cimg::strcasecmp(ext,"nii")) load_analyze(filename);
        else if (!cimg::strcasecmp(ext,"par") ||
                 !cimg::strcasecmp(ext,"rec")) load_parrec(filename);
        else if (!cimg::strcasecmp(ext,"mnc")) load_minc2(filename);
        else if (!cimg::strcasecmp(ext,"inr")) load_inr(filename);
        else if (!cimg::strcasecmp(ext,"pan")) load_pandore(filename);
        else if (!cimg::strcasecmp(ext,"cimg") ||
                 !cimg::strcasecmp(ext,"cimgz") ||
                 !*ext)  return load_cimg(filename);

        // Archive files
        else if (!cimg::strcasecmp(ext,"gz")) load_gzip_external(filename);

        // Image sequences
        else if (!cimg::strcasecmp(ext,"avi") ||
                 !cimg::strcasecmp(ext,"mov") ||
                 !cimg::strcasecmp(ext,"asf") ||
                 !cimg::strcasecmp(ext,"divx") ||
                 !cimg::strcasecmp(ext,"flv") ||
                 !cimg::strcasecmp(ext,"mpg") ||
                 !cimg::strcasecmp(ext,"m1v") ||
                 !cimg::strcasecmp(ext,"m2v") ||
                 !cimg::strcasecmp(ext,"m4v") ||
                 !cimg::strcasecmp(ext,"mjp") ||
                 !cimg::strcasecmp(ext,"mp4") ||
                 !cimg::strcasecmp(ext,"mkv") ||
                 !cimg::strcasecmp(ext,"mpe") ||
                 !cimg::strcasecmp(ext,"movie") ||
                 !cimg::strcasecmp(ext,"ogm") ||
                 !cimg::strcasecmp(ext,"ogg") ||
                 !cimg::strcasecmp(ext,"ogv") ||
                 !cimg::strcasecmp(ext,"qt") ||
                 !cimg::strcasecmp(ext,"rm") ||
                 !cimg::strcasecmp(ext,"vob") ||
                 !cimg::strcasecmp(ext,"wmv") ||
                 !cimg::strcasecmp(ext,"xvid") ||
                 !cimg::strcasecmp(ext,"mpeg")) load_video(filename);
        else throw CImgIOException("CImg<%s>::load()",
                                   pixel_type());
      } catch (CImgIOException&) {
        std::FILE *file = 0;
        try {
          file = cimg::fopen(filename,"rb");
        } catch (CImgIOException&) {
          cimg::exception_mode(omode);
          throw CImgIOException(_cimg_instance
                                "load(): Failed to open file '%s'.",
                                cimg_instance,
                                filename);
        }

        try {
          const char *const f_type = cimg::ftype(file,filename);
          std::fclose(file);
          if (!cimg::strcasecmp(f_type,"pnm")) load_pnm(filename);
          else if (!cimg::strcasecmp(f_type,"pfm")) load_pfm(filename);
          else if (!cimg::strcasecmp(f_type,"bmp")) load_bmp(filename);
          else if (!cimg::strcasecmp(f_type,"inr")) load_inr(filename);
          else if (!cimg::strcasecmp(f_type,"jpg")) load_jpeg(filename);
          else if (!cimg::strcasecmp(f_type,"pan")) load_pandore(filename);
          else if (!cimg::strcasecmp(f_type,"png")) load_png(filename);
          else if (!cimg::strcasecmp(f_type,"tif")) load_tiff(filename);
          else if (!cimg::strcasecmp(f_type,"gif")) load_gif_external(filename);
          else if (!cimg::strcasecmp(f_type,"dcm")) load_medcon_external(filename);
          else throw CImgIOException("CImg<%s>::load()",
                                     pixel_type());
        } catch (CImgIOException&) {
          try {
            load_other(filename);
          } catch (CImgIOException&) {
            cimg::exception_mode(omode);
            throw CImgIOException(_cimg_instance
                                  "load(): Failed to recognize format of file '%s'.",
                                  cimg_instance,
                                  filename);
          }
        }
      }
      cimg::exception_mode(omode);
      return *this;
    }